

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  StkId pTVar2;
  StkId func;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = L->ci->func;
  if (idx < 0) {
    L->top = L->top + (idx + 1);
  }
  else {
    while (L->top < pTVar1 + (long)idx + 1) {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->tt_ = 0;
    }
    L->top = pTVar1 + (long)idx + 1;
  }
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* 'subtract' index (index is negative) */
  }
  lua_unlock(L);
}